

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O0

void Assimp::ExportSceneXFile
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  undefined4 extraout_var;
  DeadlyImportError *pDVar4;
  pointer pIVar5;
  undefined8 uVar6;
  streamoff sVar7;
  fpos local_480 [16];
  string local_470 [38];
  undefined1 local_44a;
  allocator<char> local_449;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_408;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> outfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  undefined1 local_3b8 [8];
  XFileExporter iDoTheExportThing;
  ExportProperties props;
  string local_c0;
  undefined1 local_a0 [8];
  string file;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string path;
  ExportProperties *pProperties_local;
  aiScene *pScene_local;
  IOSystem *pIOSystem_local;
  char *pFile_local;
  
  path.field_2._8_8_ = pProperties;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pFile,&local_69);
  DefaultIOSystem::absolutePath((string *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,pFile,
             (allocator<char> *)
             ((long)&props.mMatrixProperties._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  DefaultIOSystem::completeBaseName((string *)local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&props.mMatrixProperties._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  ExportProperties::ExportProperties
            ((ExportProperties *)((long)&iDoTheExportThing.endstr.field_2 + 8),
             (ExportProperties *)path.field_2._8_8_);
  bVar1 = ExportProperties::HasPropertyBool
                    ((ExportProperties *)((long)&iDoTheExportThing.endstr.field_2 + 8),
                     "EXPORT_XFILE_64BIT");
  if (!bVar1) {
    ExportProperties::SetPropertyBool
              ((ExportProperties *)((long)&iDoTheExportThing.endstr.field_2 + 8),
               "EXPORT_XFILE_64BIT",false);
  }
  XFileExporter::XFileExporter
            ((XFileExporter *)local_3b8,pScene,pIOSystem,(string *)local_48,(string *)local_a0,
             (ExportProperties *)((long)&iDoTheExportThing.endstr.field_2 + 8));
  bVar2 = std::ios::fail();
  if ((bVar2 & 1) == 0) {
    iVar3 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
    std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
    unique_ptr<std::default_delete<Assimp::IOStream>,void>
              ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_408,
               (pointer)CONCAT44(extraout_var,iVar3));
    bVar1 = std::operator==(&local_408,(nullptr_t)0x0);
    if (!bVar1) {
      pIVar5 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                         (&local_408);
      std::__cxx11::stringstream::str();
      uVar6 = std::__cxx11::string::c_str();
      local_480 = (fpos  [16])std::ostream::tellp();
      sVar7 = std::fpos::operator_cast_to_long(local_480);
      (*pIVar5->_vptr_IOStream[3])(pIVar5,uVar6,sVar7,1);
      std::__cxx11::string::~string(local_470);
      std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                (&local_408);
      XFileExporter::~XFileExporter((XFileExporter *)local_3b8);
      ExportProperties::~ExportProperties
                ((ExportProperties *)((long)&iDoTheExportThing.endstr.field_2 + 8));
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string((string *)local_48);
      return;
    }
    local_44a = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,pFile,&local_449);
    std::operator+(&local_428,"could not open output .x file: ",&local_448);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_428);
    local_44a = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  outfile._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._6_1_ = 1;
  pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,pFile,
             (allocator<char> *)
             ((long)&outfile._M_t.
                     super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                     .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl + 7));
  std::operator+(&local_3d8,"output data creation failed. Most likely the file became too large: ",
                 &local_3f8);
  DeadlyImportError::DeadlyImportError(pDVar4,&local_3d8);
  outfile._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._6_1_ = 0;
  __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void ExportSceneXFile(const char* pFile,IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* pProperties)
{
    std::string path = DefaultIOSystem::absolutePath(std::string(pFile));
    std::string file = DefaultIOSystem::completeBaseName(std::string(pFile));

    // create/copy Properties
    ExportProperties props(*pProperties);

    // set standard properties if not set
    if (!props.HasPropertyBool(AI_CONFIG_EXPORT_XFILE_64BIT)) props.SetPropertyBool(AI_CONFIG_EXPORT_XFILE_64BIT, false);

    // invoke the exporter
    XFileExporter iDoTheExportThing( pScene, pIOSystem, path, file, &props);

    if (iDoTheExportThing.mOutput.fail()) {
        throw DeadlyExportError("output data creation failed. Most likely the file became too large: " + std::string(pFile));
    }
    
    // we're still here - export successfully completed. Write result to the given IOSYstem
    std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
    if(outfile == NULL) {
        throw DeadlyExportError("could not open output .x file: " + std::string(pFile));
    }

    // XXX maybe use a small wrapper around IOStream that behaves like std::stringstream in order to avoid the extra copy.
    outfile->Write( iDoTheExportThing.mOutput.str().c_str(), static_cast<size_t>(iDoTheExportThing.mOutput.tellp()),1);
}